

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzvec.h
# Opt level: O0

ostream * operator<<(ostream *Out,TPZVec<int> *v)

{
  _Setw _Var1;
  streamsize sVar2;
  char *pcVar3;
  int64_t iVar4;
  ostream *poVar5;
  TPZVec<int> *in_RSI;
  ostream *in_RDI;
  int64_t ii;
  int64_t size;
  char *sep;
  streamsize width;
  long local_38;
  
  sVar2 = std::ios_base::width((ios_base *)(in_RDI + *(long *)(*(long *)in_RDI + -0x18)));
  pcVar3 = "";
  if (sVar2 == 0) {
    pcVar3 = ", ";
  }
  iVar4 = TPZVec<int>::NElements(in_RSI);
  if (iVar4 != 0) {
    _Var1 = std::setw((int)sVar2);
    poVar5 = std::operator<<(in_RDI,_Var1);
    std::ostream::operator<<(poVar5,*in_RSI->fStore);
  }
  for (local_38 = 1; local_38 < iVar4; local_38 = local_38 + 1) {
    _Var1 = std::setw((int)sVar2);
    poVar5 = std::operator<<(in_RDI,_Var1);
    poVar5 = std::operator<<(poVar5,pcVar3);
    std::ostream::operator<<(poVar5,in_RSI->fStore[local_38]);
  }
  return in_RDI;
}

Assistant:

std::ostream& operator<<( std::ostream& Out, const TPZVec< T >& v )
{
	std::streamsize width = Out.width();
	
	const char* sep = ( width == 0 ? ", " : "" );
	
	int64_t size = v.NElements();
	
	if(size) Out << std::setw(width) << v.fStore[0];
	
	for( int64_t ii = 1; ii < size; ii++ )
	{
	    Out << std::setw( width ) << sep << v.fStore[ ii ];
	}
	
	return Out;
}